

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

void __thiscall Peeps::PeepFunc(Peeps *this)

{
  PeepsMD *this_00;
  char cVar1;
  ushort uVar2;
  OpCode OVar3;
  LabelInstr *pLVar4;
  Opnd *pOVar5;
  Func *pFVar6;
  code *pcVar7;
  char cVar8;
  bool bVar9;
  OpndKind OVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  JITTimeFunctionBody *pJVar17;
  FunctionJITTimeInfo *pFVar18;
  undefined4 *puVar19;
  Func *instrNext;
  Instr *pIVar20;
  RegOpnd *pRVar21;
  Instr *instr;
  Func *pFVar22;
  IntConstOpnd *src2Opnd;
  Func *pFVar23;
  char *message;
  char *error;
  char *pcVar24;
  Func *pFVar25;
  RegNum reg;
  bool local_33;
  bool local_32;
  char local_31;
  bool peeped;
  bool peeped_1;
  
  pJVar17 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar15 = JITTimeFunctionBody::GetSourceContextId(pJVar17);
  pFVar18 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar16 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar18);
  cVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,PeepsPhase,uVar15,uVar16);
  AgenPeeps::PeepFunc(&this->peepsAgen);
  this_00 = &this->peepsMD;
  PeepsMD::Init(this_00,this);
  memset(this->regMap,0,0x108);
  SymTable::ClearStackSymScratch(this->func->m_symTable);
  pFVar25 = (Func *)this->func->m_headInstr;
  if (pFVar25 != (Func *)0x0) {
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar12 = false;
    local_31 = cVar8;
    do {
      instrNext = (Func *)pFVar25->m_threadContextInfo;
      cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
      switch(cVar1) {
      case '\x02':
        if ((cVar8 == '\0') && ((short)pFVar25->constructorCacheCount != 0xeb)) {
          if (cVar1 != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar19 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
            if (!bVar9) goto LAB_00623c1a;
            *puVar19 = 0;
          }
          if ((pFVar25->callSiteToArgumentsOffsetFixupMap ==
               (CallSiteToArgumentsOffsetFixupMap *)0x0) ||
             ((ushort)((short)*(undefined4 *)&pFVar25->callSiteToArgumentsOffsetFixupMap->stats -
                      0x299U) < 0xfffe)) {
            instrNext = (Func *)PeepBranch((BranchInstr *)pFVar25,(bool *)0x0);
            if ((instrNext == (Func *)0x0) ||
               ((Instr *)instrNext->m_scriptContextInfo == (Instr *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar19 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                 ,0x7c,"(instrNext && instrNext->m_prev)",
                                 "instrNext && instrNext->m_prev");
              if (!bVar9) goto LAB_00623c1a;
              *puVar19 = 0;
            }
            if ((((BranchInstr *)instrNext->m_scriptContextInfo)->super_Instr).m_kind ==
                InstrKindBranch) {
              instrNext = (Func *)HoistSameInstructionAboveSplit
                                            (this,(BranchInstr *)instrNext->m_scriptContextInfo,
                                             (Instr *)instrNext);
            }
          }
        }
        break;
      case '\x03':
      case '\x05':
        if (cVar8 == '\0') {
          reg = RegRAX;
          do {
            ClearReg(this,reg);
            reg = reg + RegRAX;
          } while (reg != RegNumCount);
          cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
          if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar19 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar9) goto LAB_00623c1a;
            *puVar19 = 0;
          }
          pcVar24 = (char *)pFVar25;
          if ((pFVar25->propertyGuardsByPropertyId ==
               (PropertyGuardByPropertyIdMap *)&pFVar25->propertyGuardsByPropertyId) &&
             (((ulong)pFVar25->propertiesWrittenTo & 4) == 0)) {
            cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
            if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar19 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar9) goto LAB_00623c1a;
              *puVar19 = 0;
            }
            instrNext = (Func *)PeepUnreachableLabel((LabelInstr *)pFVar25,bVar12,&local_33);
            if (local_33 == false) {
LAB_00623851:
              cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
              if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                pcVar24 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                ;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                    ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                if (!bVar12) goto LAB_00623c1a;
                *puVar19 = 0;
              }
              bVar11 = *(byte *)&pFVar25->propertiesWrittenTo;
              cVar1 = *(undefined1 *)((long)&instrNext->constructorCaches + 1);
              if ((cVar1 == '\x05') || (cVar1 == '\x03')) {
                cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
                if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar12 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                  if (!bVar12) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
                cVar1 = *(undefined1 *)((long)&instrNext->constructorCaches + 1);
                if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar12 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                  if (!bVar12) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
                instrNext = (Func *)CleanupLabel((LabelInstr *)pFVar25,(LabelInstr *)instrNext);
                pcVar24 = (char *)pFVar25;
              }
              cVar1 = *(undefined1 *)((long)&instrNext->constructorCaches + 1);
              if ((((cVar1 != '\x03') && (cVar1 != '\x05')) &&
                  (cVar1 = *(undefined1 *)
                            ((long)&instrNext->m_scriptContextInfo[7]._vptr_ScriptContextInfo + 1),
                  cVar1 != '\x03')) && (cVar1 != '\x05')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                pcVar24 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                ;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                    ,0x61,
                                    "(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr())"
                                    ,
                                    "instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr()"
                                   );
                if (!bVar12) goto LAB_00623c1a;
                *puVar19 = 0;
              }
              cVar1 = *(undefined1 *)((long)&instrNext->constructorCaches + 1);
              pFVar25 = instrNext;
              if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                pFVar25 = (Func *)instrNext->m_scriptContextInfo;
                cVar1 = *(undefined1 *)((long)&pFVar25->constructorCaches + 1);
                if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  pcVar24 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                  ;
                  bVar12 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                      ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                  if (!bVar12) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
              }
              if ((bVar11 & 2) == 0) {
                bVar9 = false;
              }
              else {
                bVar9 = (bool)((*(byte *)&pFVar25->propertiesWrittenTo & 2) >> 1);
              }
              bVar12 = (bool)((bVar11 & 2) >> 1);
              instrNext = (Func *)PeepCondMove((Peeps *)pcVar24,(LabelInstr *)pFVar25,
                                               (Instr *)instrNext,bVar9);
            }
          }
          else {
            pFVar23 = (Func *)IR::Instr::GetPrevRealInstr((Instr *)pFVar25);
            bVar11 = 1;
            if (*(IRKind *)((long)&pFVar23->constructorCaches + 1) == InstrKindBranch) {
              OVar3 = *(OpCode *)&pFVar23->constructorCacheCount;
              if (OVar3 < ADD) {
                bVar9 = OVar3 == MultiBr || OVar3 == Br;
              }
              else {
                pcVar24 = (char *)pFVar23;
                bVar9 = LowererMD::IsUnconditionalBranch((Instr *)pFVar23);
              }
              if (bVar9 != false) {
                pLVar4 = (LabelInstr *)pFVar23->callSiteToArgumentsOffsetFixupMap;
                bVar9 = *(bool *)((long)&pFVar23->propertyGuardsByPropertyId + 1);
                if (pLVar4 == (LabelInstr *)0x0) {
                  if (bVar9 == false) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar19 = 1;
                    uVar15 = 0x20e;
                    error = "(m_isMultiBranch)";
                    message = "m_isMultiBranch";
                    goto LAB_006237f5;
                  }
                }
                else if (bVar9 != false) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  uVar15 = 0x209;
                  error = "(!m_isMultiBranch)";
                  message = "!m_isMultiBranch";
LAB_006237f5:
                  pcVar24 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                  ;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,uVar15,error,message);
                  if (!bVar9) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
                if ((pLVar4 != (LabelInstr *)0x0) &&
                   ((Func *)pFVar23->callSiteToArgumentsOffsetFixupMap == pFVar25)) {
                  pFVar6 = ((PeepsMD *)&pFVar23->m_threadContextInfo)->func;
                  pFVar22 = (Func *)PeepBranch((BranchInstr *)pFVar23,&local_32);
                  bVar11 = pFVar22 != pFVar6 | local_32;
                  if (bVar11 != 0) {
                    instrNext = pFVar22;
                  }
                  bVar11 = bVar11 ^ 1;
                  pcVar24 = (char *)pFVar23;
                }
              }
            }
            cVar8 = local_31;
            if (bVar11 != 0) goto LAB_00623851;
          }
        }
        break;
      default:
        bVar9 = LowererMD::IsAssign((Instr *)pFVar25);
        if (bVar9) {
          if (cVar8 == '\0') {
            instrNext = (Func *)PeepAssign(this,(Instr *)pFVar25);
          }
        }
        else {
          uVar2 = (ushort)pFVar25->constructorCacheCount;
          if (uVar2 < 0x412) {
            if (((uVar2 == 7) || (uVar2 == 0x18a)) || (uVar2 == 0x1ee)) goto LAB_0062345f;
LAB_00623614:
            if (cVar8 == '\0') {
              pIVar20 = PeepRedundant(this,(Instr *)pFVar25);
              pOVar5 = pIVar20->m_dst;
              if ((pOVar5 != (Opnd *)0x0) &&
                 (OVar10 = IR::Opnd::GetKind(pOVar5), OVar10 == OpndKindReg)) {
                OVar10 = IR::Opnd::GetKind(pOVar5);
                if (OVar10 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar9) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
                ClearReg(this,*(RegNum *)((long)&pOVar5[1].m_valueType.field_0.bits + 1));
              }
              PeepsMD::ProcessImplicitRegs(this_00,pIVar20);
              if ((pIVar20->m_opcode == TEST) &&
                 (OVar10 = IR::Opnd::GetKind(pIVar20->m_src2), OVar10 == OpndKindIntConst)) {
                pOVar5 = pIVar20->m_src2;
                OVar10 = IR::Opnd::GetKind(pOVar5);
                if (OVar10 != OpndKindIntConst) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar19 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()"
                                    );
                  if (!bVar9) goto LAB_00623c1a;
                  *puVar19 = 0;
                }
                if ((((ulong)pOVar5[1]._vptr_Opnd & 0xffffff00) == 0) &&
                   (OVar10 = IR::Opnd::GetKind(pIVar20->m_src1), OVar10 == OpndKindReg)) {
                  pRVar21 = IR::Opnd::AsRegOpnd(pIVar20->m_src1);
                  bVar11 = LinearScan::GetRegAttribs(pRVar21->m_reg);
                  if ((((bVar11 & 8) != 0) &&
                      (*(IRKind *)((long)&instrNext->constructorCaches + 1) == InstrKindBranch)) &&
                     ((*(OpCode *)&instrNext->constructorCacheCount == JNE ||
                      (*(OpCode *)&instrNext->constructorCacheCount == JEQ)))) {
                    pIVar20->m_src1->m_type = TyInt8;
                    pIVar20->m_src2->m_type = TyInt8;
                  }
                }
              }
              if (pIVar20->m_opcode == CVTSI2SD) {
                pOVar5 = pIVar20->m_dst;
                instr = IR::Instr::New(XORPS,pOVar5,pOVar5,pOVar5,pIVar20->m_func);
                IR::Instr::InsertBefore(pIVar20,instr);
              }
            }
          }
          else {
            if ((uVar2 == 0x412) || (uVar2 == 0x41b)) {
              if (cVar8 != '\0') break;
              bVar9 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
              if (bVar9) {
LAB_0062358f:
                if (*(undefined1 *)((long)&pFVar25->constructorCaches + 1) == '\x06') {
LAB_0062359a:
                  bVar13 = false;
                }
                else {
                  pIVar20 = IR::Instr::GetPrevRealInstr((Instr *)pFVar25);
                  bVar9 = IsJccOrShiftInstr(pIVar20);
                  bVar13 = true;
                  if (!bVar9) {
                    if (pIVar20->m_kind == InstrKindEntry) goto LAB_0062359a;
                    pIVar20 = IR::Instr::GetPrevRealInstr(pIVar20);
                    bVar13 = IsJccOrShiftInstr(pIVar20);
                  }
                }
                bVar9 = bVar13;
                if ((bVar13 == false) &&
                   (*(undefined1 *)((long)&pFVar25->constructorCaches + 1) != '\a')) {
                  pIVar20 = IR::Instr::GetNextRealInstr((Instr *)pFVar25);
                  bVar14 = IsJccOrShiftInstr(pIVar20);
                  bVar9 = true;
                  if ((!bVar14) && (bVar9 = bVar13, pIVar20->m_kind != InstrKindExit)) {
                    pIVar20 = IR::Instr::GetNextRealInstr(pIVar20);
                    bVar14 = IsJccOrShiftInstr(pIVar20);
                    if (bVar14) {
                      bVar9 = true;
                    }
                  }
                }
                if (bVar9 != false) {
                  src2Opnd = IR::IntConstOpnd::New
                                       (1,*(IRType *)
                                           ((long)&(pFVar25->pinnedTypeRefs->
                                                                                                      
                                                  super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                                  ).entries + 2),(Func *)pFVar25->m_workItem,false);
                  pFVar23 = (Func *)IR::Instr::New(ADD,(Opnd *)pFVar25->pinnedTypeRefs,
                                                   (Opnd *)pFVar25->pinnedTypeRefs,
                                                   &src2Opnd->super_Opnd,(Func *)pFVar25->m_workItem
                                                  );
                  if ((short)pFVar25->constructorCacheCount == 0x412) {
                    *(OpCode *)&pFVar23->constructorCacheCount = SUB;
                  }
                  IR::Instr::InsertAfter((Instr *)pFVar25,(Instr *)pFVar23);
                  IR::Instr::Remove((Instr *)pFVar25);
                  pFVar25 = pFVar23;
                }
              }
              else {
                pJVar17 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar15 = JITTimeFunctionBody::GetSourceContextId(pJVar17);
                pFVar18 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar16 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar18);
                bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,AtomPhase,uVar15,uVar16);
                if (bVar9) goto LAB_0062358f;
              }
              pOVar5 = (Opnd *)pFVar25->pinnedTypeRefs;
              if (pOVar5 == (Opnd *)0x0) break;
              OVar10 = IR::Opnd::GetKind(pOVar5);
            }
            else {
              if (uVar2 != 0x442) goto LAB_00623614;
              PeepsMD::PeepAssign(this_00,(Instr *)pFVar25);
              pOVar5 = (Opnd *)pFVar25->pinnedTypeRefs;
              if (pOVar5 == (Opnd *)0x0) break;
              OVar10 = IR::Opnd::GetKind(pOVar5);
            }
            if (OVar10 == OpndKindReg) {
              OVar10 = IR::Opnd::GetKind(pOVar5);
              if (OVar10 != OpndKindReg) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar19 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                if (!bVar9) {
LAB_00623c1a:
                  pcVar7 = (code *)invalidInstructionException();
                  (*pcVar7)();
                }
                *puVar19 = 0;
              }
              ClearReg(this,*(byte *)((long)&pOVar5[1].m_valueType.field_0.bits + 1));
            }
          }
        }
        break;
      case '\b':
        if ((short)pFVar25->constructorCacheCount == 6) {
LAB_0062345f:
          IR::Instr::Remove((Instr *)pFVar25);
        }
      }
      pFVar25 = instrNext;
    } while (instrNext != (Func *)0x0);
  }
  return;
}

Assistant:

void
Peeps::PeepFunc()
{
    bool peepsEnabled = true;
    if (PHASE_OFF(Js::PeepsPhase, this->func))
    {
        peepsEnabled = false;
    }

#if defined(_M_IX86) || defined(_M_X64)
    // Agen dependency elimination pass
    // Since it can reveal load elimination opportunities for the normal peeps pass, we do it separately.
    this->peepsAgen.PeepFunc();
#endif

    this->peepsMD.Init(this);

    // Init regMap
    memset(this->regMap, 0, sizeof(this->regMap));

    // Scratch field needs to be cleared.
    this->func->m_symTable->ClearStackSymScratch();

    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            if (!peepsEnabled)
            {
                break;
            }
            // Don't carry any regMap info across label
            this->ClearRegMap();

            // Remove unreferenced labels
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                bool peeped;
                instrNext = PeepUnreachableLabel(instr->AsLabelInstr(), isInHelper, &peeped);
                if(peeped)
                {
                    continue;
                }
            }
            else
            {
                // Try to peep a previous branch again after dead label blocks are removed. For instance:
                //         jmp L2
                //     L3:
                //         // dead code
                //     L2:
                // L3 is unreferenced, so after that block is removed, the branch-to-next can be removed. After that, if L2 is
                // unreferenced and only has fallthrough, it can be removed as well.
                IR::Instr *const prevInstr = instr->GetPrevRealInstr();
                if(prevInstr->IsBranchInstr())
                {
                    IR::BranchInstr *const branch = prevInstr->AsBranchInstr();
                    if(branch->IsUnconditional() && !branch->IsMultiBranch() && branch->GetTarget() == instr)
                    {
                        bool peeped;
                        IR::Instr *const branchNext = branch->m_next;
                        IR::Instr *const branchNextAfterPeep = PeepBranch(branch, &peeped);
                        if(peeped || branchNextAfterPeep != branchNext)
                        {
                            // The peep did something, restart from after the branch
                            instrNext = branchNextAfterPeep;
                            continue;
                        }
                    }
                }
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;

            if (instrNext->IsLabelInstr())
            {
                // CLean up double label
                instrNext = this->CleanupLabel(instr->AsLabelInstr(), instrNext->AsLabelInstr());
            }

#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr());
            IR::LabelInstr *const peepCondMoveLabel =
                instrNext->IsLabelInstr() ? instrNext->AsLabelInstr() : instrNext->m_prev->AsLabelInstr();
            instrNext = PeepCondMove(peepCondMoveLabel, instrNext, isInHelper && peepCondMoveLabel->isOpHelper);
#endif

            break;
        }

        case IR::InstrKindBranch:
        {
            if (!peepsEnabled || instr->m_opcode == Js::OpCode::Leave)
            {
                break;
            }

            IR::BranchInstr *branchInstr = instr->AsBranchInstr();
            IR::LabelInstr* target = branchInstr->GetTarget();

            // Don't remove any branches to the generator's epilogue
            if (target != nullptr && target->IsGeneratorEpilogueLabel())
            {
                break;
            }

            instrNext = Peeps::PeepBranch(branchInstr);
#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext && instrNext->m_prev);
            if (instrNext->m_prev->IsBranchInstr())
            {
                instrNext = this->HoistSameInstructionAboveSplit(instrNext->m_prev->AsBranchInstr(), instrNext);
            }

#endif
            break;
        }
        case IR::InstrKindPragma:
            if (instr->m_opcode == Js::OpCode::Nop)
            {
                instr->Remove();
            }
            break;

        default:
            if (LowererMD::IsAssign(instr))
            {
                if (!peepsEnabled)
                {
                    break;
                }
                // Cleanup spill code
                instrNext = this->PeepAssign(instr);
            }
            else if (instr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                || instr->m_opcode == Js::OpCode::StartCall
                || instr->m_opcode == Js::OpCode::LoweredStartCall)
            {
                // ArgOut/StartCall are normally lowered by the lowering of the associated call instr.
                // If the call becomes unreachable, we could end up with an orphan ArgOut or StartCall.
                // Just delete these StartCalls
                instr->Remove();
            }
#if defined(_M_IX86) || defined(_M_X64)
            else if (instr->m_opcode == Js::OpCode::MOVSD_ZERO)
            {
                this->peepsMD.PeepAssign(instr);
                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }
            else if ( (instr->m_opcode == Js::OpCode::INC ) || (instr->m_opcode == Js::OpCode::DEC) )
            {
                // Check for any of the following patterns which can cause partial flag dependency
                //
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                // INC or DEC                                             INC or DEC
                // -------------------------------------------------- OR -----------------------
                // INC or DEC                                             INC or DEC
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                //
                // With this optimization if any of the above pattern found, substitute INC/DEC with ADD/SUB respectively.
                if (!peepsEnabled)
                {
                    break;
                }

                if (AutoSystemInfo::Data.IsAtomPlatform() || PHASE_FORCE(Js::AtomPhase, this->func))
                {
                    bool pattern_found=false;

                    if ( !(instr->IsEntryInstr()) )
                    {
                        IR::Instr *prevInstr = instr->GetPrevRealInstr();
                        if ( IsJccOrShiftInstr(prevInstr)  )
                        {
                            pattern_found = true;
                        }
                        else if ( !(prevInstr->IsEntryInstr()) && IsJccOrShiftInstr(prevInstr->GetPrevRealInstr()) )
                        {
                            pattern_found=true;
                        }
                    }

                    if ( !pattern_found && !(instr->IsExitInstr()) )
                    {
                        IR::Instr *nextInstr = instr->GetNextRealInstr();
                        if ( IsJccOrShiftInstr(nextInstr) )
                        {
                            pattern_found = true;
                        }
                        else if ( !(nextInstr->IsExitInstr() ) && (IsJccOrShiftInstr(nextInstr->GetNextRealInstr())) )
                        {
                            pattern_found = true;
                        }
                    }

                    if (pattern_found)
                    {
                        IR::IntConstOpnd* constOne  = IR::IntConstOpnd::New((IntConstType) 1, instr->GetDst()->GetType(), instr->m_func);
                        IR::Instr * addOrSubInstr = IR::Instr::New(Js::OpCode::ADD, instr->GetDst(), instr->GetDst(), constOne, instr->m_func);

                        if (instr->m_opcode == Js::OpCode::DEC)
                        {
                            addOrSubInstr->m_opcode = Js::OpCode::SUB;
                        }

                        instr->InsertAfter(addOrSubInstr);
                        instr->Remove();
                        instr = addOrSubInstr;
                    }
                }

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }

#endif
            else
            {
                if (!peepsEnabled)
                {
                    break;
                }
#if defined(_M_IX86) || defined(_M_X64)
               instr = this->PeepRedundant(instr);
#endif

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
                // Kill callee-saved regs across calls and other implicit regs
                this->peepsMD.ProcessImplicitRegs(instr);

#if defined(_M_IX86) || defined(_M_X64)
                if (instr->m_opcode == Js::OpCode::TEST && instr->GetSrc2()->IsIntConstOpnd()
                    && ((instr->GetSrc2()->AsIntConstOpnd()->GetValue() & 0xFFFFFF00) == 0)
                    && instr->GetSrc1()->IsRegOpnd() && (LinearScan::GetRegAttribs(instr->GetSrc1()->AsRegOpnd()->GetReg()) & RA_BYTEABLE))
                {
                    // Only support if the branch is JEQ or JNE to ensure we don't look at the sign flag
                    if (instrNext->IsBranchInstr() &&
                        (instrNext->m_opcode == Js::OpCode::JNE || instrNext->m_opcode == Js::OpCode::JEQ))
                    {
                        instr->GetSrc1()->SetType(TyInt8);
                        instr->GetSrc2()->SetType(TyInt8);
                    }
                }

                if (instr->m_opcode == Js::OpCode::CVTSI2SD)
                {
                    IR::Instr *xorps = IR::Instr::New(Js::OpCode::XORPS, instr->GetDst(), instr->GetDst(), instr->GetDst(), instr->m_func);
                    instr->InsertBefore(xorps);
                }
#endif
            }
        }
    }